

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

string * __thiscall
pbrt::AtomicDouble::ToString_abi_cxx11_(string *__return_storage_ptr__,AtomicDouble *this)

{
  __atomic_base<unsigned_long> local_10;
  
  local_10._M_i = (this->bits).super___atomic_base<unsigned_long>._M_i;
  StringPrintf<double>(__return_storage_ptr__,"%f",(double *)&local_10);
  return __return_storage_ptr__;
}

Assistant:

std::string AtomicDouble::ToString() const {
    return StringPrintf("%f", double(*this));
}